

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  unsigned_short uVar1;
  int iVar2;
  uint i_00;
  ImFontGlyph *pIVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  ImFontGlyph *__src;
  ImFont *in_RDI;
  int i_2;
  ImFontGlyph *tab_glyph;
  int page_n;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar6;
  float in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  int in_stack_ffffffffffffffc4;
  int local_2c;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 != (in_RDI->Glyphs).Size; local_10 = local_10 + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_10);
    iVar2 = ImMax<int>(local_c,*(uint *)pIVar3 >> 2);
    in_stack_ffffffffffffffc4 = local_c;
    local_c = iVar2;
  }
  ImVector<float>::clear
            ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  ImVector<unsigned_short>::clear
            ((ImVector<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI->DirtyLookupTables = false;
  memset(in_RDI->Used4kPagesMap,0,2);
  GrowIndex((ImFont *)
            CONCAT44(in_stack_ffffffffffffffc4,
                     CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
            in_stack_ffffffffffffffbc);
  for (local_14 = 0; local_14 < (in_RDI->Glyphs).Size; local_14 = local_14 + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    i_00 = *(uint *)pIVar3 >> 2;
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    fVar6 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,i_00);
    *pfVar4 = fVar6;
    uVar1 = (unsigned_short)local_14;
    puVar5 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,i_00);
    *puVar5 = uVar1;
    iVar2 = (int)(i_00 / 0x1000) >> 3;
    in_RDI->Used4kPagesMap[iVar2] =
         in_RDI->Used4kPagesMap[iVar2] | (byte)(1 << ((byte)(i_00 / 0x1000) & 7));
  }
  pIVar3 = FindGlyph(in_RDI,0x20);
  if (pIVar3 != (ImFontGlyph *)0x0) {
    pIVar3 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    if (*(uint *)pIVar3 >> 2 != 9) {
      ImVector<ImFontGlyph>::resize
                ((ImVector<ImFontGlyph> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    pIVar3 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    __src = FindGlyph(in_RDI,0x20);
    memcpy(pIVar3,__src,0x28);
    *(uint *)pIVar3 = *(uint *)pIVar3 & 3 | 0x24;
    pIVar3->AdvanceX = pIVar3->AdvanceX * 4.0;
    in_stack_ffffffffffffffb4 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,*(uint *)pIVar3 >> 2);
    *pfVar4 = in_stack_ffffffffffffffb4;
    iVar2 = (in_RDI->Glyphs).Size;
    puVar5 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,*(uint *)pIVar3 >> 2);
    *puVar5 = (short)iVar2 - 1;
  }
  SetGlyphVisible((ImFont *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (ImWchar)((uint)in_stack_ffffffffffffffac >> 0x10),
                  SUB41((uint)in_stack_ffffffffffffffac >> 8,0));
  SetGlyphVisible((ImFont *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (ImWchar)((uint)in_stack_ffffffffffffffac >> 0x10),
                  SUB41((uint)in_stack_ffffffffffffffac >> 8,0));
  pIVar3 = FindGlyphNoFallback(in_RDI,in_RDI->FallbackChar);
  in_RDI->FallbackGlyph = pIVar3;
  if (in_RDI->FallbackGlyph == (ImFontGlyph *)0x0) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = in_RDI->FallbackGlyph->AdvanceX;
  }
  in_RDI->FallbackAdvanceX = fVar6;
  for (local_2c = 0; local_2c < local_c + 1; local_2c = local_2c + 1) {
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_2c);
    if (*pfVar4 <= 0.0 && *pfVar4 != 0.0) {
      fVar6 = in_RDI->FallbackAdvanceX;
      pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_2c);
      *pfVar4 = fVar6;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}